

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsElfFile.cpp
# Opt level: O2

ssize_t __thiscall MipsElfFile::write(MipsElfFile *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  ElfSegment *this_00;
  undefined8 in_RAX;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined4 in_register_00000034;
  
  iVar1 = this->segment;
  if ((long)iVar1 == -1) {
    if (this->section == -1) {
      Logger::printError<>(Error,"Not inside a section");
      in_RAX = extraout_RAX_00;
    }
  }
  else {
    this_00 = (this->elf).segments.super__Vector_base<ElfSegment_*,_std::allocator<ElfSegment_*>_>.
              _M_impl.super__Vector_impl_data._M_start[iVar1];
    ElfSegment::writeToData
              (this_00,(ulong)((this_00->sections).
                               super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>.
                               _M_impl.super__Vector_impl_data._M_start[this->section]->header).
                              sh_offset + this->sectionOffset,
               (void *)CONCAT44(in_register_00000034,__fd),(size_t)__buf);
    this->sectionOffset = this->sectionOffset + (long)__buf;
    in_RAX = extraout_RAX;
  }
  return CONCAT71((int7)((ulong)in_RAX >> 8),iVar1 != -1);
}

Assistant:

bool MipsElfFile::write(void* data, size_t length)
{
	if (segment != -1)
	{
		ElfSegment* seg = elf.getSegment(segment);
		ElfSection* sect = seg->getSection(section);

		int64_t pos = sect->getOffset()+sectionOffset;
		seg->writeToData(pos,data,length);
		sectionOffset += length;
		return true;
	}

	if (section != -1)
	{
		// TODO: segmentless sections
		return false;
	}

	Logger::printError(Logger::Error, "Not inside a section");
	return false;
}